

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void sendTempo(State *state)

{
  UdpSender *this;
  rep rVar1;
  ostream *poVar2;
  OutboundPacketStream *pOVar3;
  char *packet;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  BeginMessage local_528 [3];
  undefined1 local_510 [8];
  OutboundPacketStream p;
  int usec;
  int sec;
  double timetag_ut;
  duration<long,_std::ratio<1L,_1000000000L>_> local_4c0;
  duration<long,_std::ratio<1L,_1000L>_> local_4b8;
  rep local_4b0;
  unsigned_long milliseconds_since_epoch;
  char buffer [1024];
  rep t;
  double cps;
  double cycle;
  double phase;
  double beats;
  double tempo;
  microseconds local_58;
  microseconds time;
  double quantum;
  Timeline timeline;
  State *state_local;
  
  timeline.mTimeline.timeOrigin.__r = (rep)state;
  ableton::Link::captureAppTimeline((Timeline *)&quantum,&state->link);
  time.__r = *(rep *)(timeline.mTimeline.timeOrigin.__r + 0x568);
  ableton::Link::clock((Link *)(timeline.mTimeline.timeOrigin.__r + 8));
  local_58 = ableton::platforms::linux::Clock<1>::micros((Clock<1> *)((long)&tempo + 7));
  ableton::Link::Timeline::tempo((Timeline *)&quantum);
  dVar5 = ableton::Link::Timeline::beatAtTime((Timeline *)&quantum,local_58,(double)time.__r);
  ableton::Link::Timeline::phaseAtTime((Timeline *)&quantum,local_58,(double)time.__r);
  dVar5 = dVar5 / (double)time.__r;
  dVar6 = ableton::Link::Timeline::tempo((Timeline *)&quantum);
  dVar6 = (dVar6 / (double)time.__r) / 60.0;
  buffer[0x3f8] = (undefined1)local_58.__r;
  buffer[0x3f9] = local_58.__r._1_1_;
  buffer[0x3fa] = local_58.__r._2_1_;
  buffer[0x3fb] = local_58.__r._3_1_;
  buffer[0x3fc] = local_58.__r._4_1_;
  buffer[0x3fd] = local_58.__r._5_1_;
  buffer[0x3fe] = local_58.__r._6_1_;
  buffer[0x3ff] = local_58.__r._7_1_;
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)(buffer + 0x3f8));
  if (sendTempo::diff == 0) {
    timetag_ut = (double)std::chrono::_V2::system_clock::now();
    local_4c0.__r =
         (rep)std::chrono::
              time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&timetag_ut);
    local_4b8.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_4c0);
    local_4b0 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_4b8);
    sendTempo::diff = (local_4b0 * 1000 + 500) - rVar1;
  }
  dVar7 = (double)(rVar1 + sendTempo::diff) / 1000000.0 + -0.2;
  dVar8 = floor(dVar7);
  p._52_4_ = (BADTYPE)dVar8;
  dVar7 = floor((dVar7 - (double)(int)p._52_4_) * 1000000.0);
  p._48_4_ = (BADTYPE)dVar7;
  osc::OutboundPacketStream::OutboundPacketStream
            ((OutboundPacketStream *)local_510,(char *)&milliseconds_since_epoch,0x400);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nnew cps: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar6);
  poVar2 = std::operator<<(poVar2," | last cps: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sendTempo::last_cps);
  std::operator<<(poVar2,"\n");
  sendTempo::last_cps = dVar6;
  osc::BeginMessage::BeginMessage(local_528,"/tempo");
  pOVar3 = osc::OutboundPacketStream::operator<<((OutboundPacketStream *)local_510,local_528);
  pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,p._52_4_);
  pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,p._48_4_);
  pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,(float)dVar5);
  pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,(float)dVar6);
  pOVar3 = osc::OutboundPacketStream::operator<<(pOVar3,"True");
  osc::OutboundPacketStream::operator<<(pOVar3,(MessageTerminator *)&osc::EndMessage);
  this = sender;
  packet = osc::OutboundPacketStream::Data((OutboundPacketStream *)local_510);
  sVar4 = osc::OutboundPacketStream::Size((OutboundPacketStream *)local_510);
  UdpSender::Send(this,packet,(int)sVar4);
  osc::OutboundPacketStream::~OutboundPacketStream((OutboundPacketStream *)local_510);
  return;
}

Assistant:

void sendTempo(State& state) {
  auto timeline = state.link.captureAppTimeline();
  auto quantum = state.quantum;
  const auto time = state.link.clock().micros();
  const auto tempo = timeline.tempo();
  const auto beats = timeline.beatAtTime(time, quantum);
  const auto phase = timeline.phaseAtTime(time, quantum);
  const auto cycle = beats / quantum;
  const double cps = (timeline.tempo() / quantum) / 60;
  const auto t     = std::chrono::microseconds(time).count();
  static long diff = 0;
  static double last_cps = -1;
  char buffer[OUTPUT_BUFFER_SIZE];
  if (diff == 0) {
    unsigned long milliseconds_since_epoch = 
      std::chrono::duration_cast<std::chrono::milliseconds>
      (std::chrono::system_clock::now().time_since_epoch()).count();
    // POSIX is millis and Link is micros.. Not sure if that `+500` helps
    diff = ((milliseconds_since_epoch*1000 + 500) - t);
  }
  double timetag_ut = ((double) (t + diff)) / ((double) 1000000);
  // latency hack
  timetag_ut -= 0.2;
  int sec = floor(timetag_ut);
  int usec = floor(1000000 * (timetag_ut - sec));
  osc::OutboundPacketStream p( buffer, OUTPUT_BUFFER_SIZE );
  std::cout << "\nnew cps: " << cps << " | last cps: " << last_cps << "\n";
  last_cps = cps;
  p << osc::BeginMessage( "/tempo" )
    << sec << usec
    << (float) cycle << (float) cps << "True" << osc::EndMessage;
  //s.Send( p.Data(), p.Size() );
  sender->Send((char *)p.Data(), p.Size());
}